

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  string odir;
  
  if ((this->super_cmInstallGenerator).ExcludeFromAll == false) {
    PVar1 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082);
    if (PVar1 - NEW < 3) {
      std::__cxx11::string::string((string *)&odir,(string *)&this->BinaryDirectory);
      cmsys::SystemTools::ConvertToUnixSlashes(&odir);
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)0x0);
      poVar2 = std::operator<<(poVar2,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
      poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)0x2);
      poVar2 = std::operator<<(poVar2,"# Include the install script for the subdirectory.\n");
      poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)0x2);
      poVar2 = std::operator<<(poVar2,"include(\"");
      poVar2 = std::operator<<(poVar2,(string *)&odir);
      poVar2 = std::operator<<(poVar2,"/cmake_install.cmake\")\n");
      poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)0x0);
      std::operator<<(poVar2,"endif()\n\n");
      std::__cxx11::string::~string((string *)&odir);
    }
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->ExcludeFromAll) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}